

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall QTableWidgetPrivate::setup(QTableWidgetPrivate *this)

{
  QTableWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QTableWidget *q;
  QAbstractItemView *pQVar1;
  array<QMetaObject::Connection,_10UL> *paVar2;
  array<QMetaObject::Connection,_10UL> *this_00;
  offset_in_QTableWidget_to_subr *in_stack_fffffffffffffe60;
  ContextType *in_stack_fffffffffffffe68;
  Object *in_stack_fffffffffffffe70;
  ConnectionType type;
  Object *in_stack_fffffffffffffe78;
  code *receiverPrivate;
  Object *in_stack_fffffffffffffe80;
  Object *sender;
  offset_in_QItemSelectionModel_to_subr signal;
  Function in_stack_fffffffffffffea0;
  Function slot;
  offset_in_QAbstractItemView_to_subr in_stack_fffffffffffffeb0;
  offset_in_QAbstractItemModel_to_subr signal_00;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTableWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)in_stack_fffffffffffffe80,in_stack_fffffffffffffeb0,in_stack_fffffffffffffe78
             ,in_stack_fffffffffffffea0,(ConnectionType)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTableWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)in_stack_fffffffffffffe80,in_stack_fffffffffffffeb0,in_stack_fffffffffffffe78
             ,in_stack_fffffffffffffea0,(ConnectionType)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTableWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)in_stack_fffffffffffffe80,in_stack_fffffffffffffeb0,in_stack_fffffffffffffe78
             ,in_stack_fffffffffffffea0,(ConnectionType)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTableWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)in_stack_fffffffffffffe80,in_stack_fffffffffffffeb0,in_stack_fffffffffffffe78
             ,in_stack_fffffffffffffea0,(ConnectionType)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  signal_00 = 0;
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTableWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)in_stack_fffffffffffffe80,0,in_stack_fffffffffffffe78,
             in_stack_fffffffffffffea0,(ConnectionType)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  slot = 0;
  pQVar1 = (QAbstractItemView *)0x0;
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QTableWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)in_stack_fffffffffffffe80,signal_00,in_stack_fffffffffffffe78,0,
             (ConnectionType)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  paVar2 = (array<QMetaObject::Connection,_10UL> *)local_28;
  QAbstractItemView::selectionModel(pQVar1);
  signal = 0;
  pQVar1 = (QAbstractItemView *)0x0;
  QObjectPrivate::
  connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QTableWidgetPrivate::*)(QModelIndex_const&,QModelIndex_const&)>
            (in_stack_fffffffffffffe80,signal_00,in_stack_fffffffffffffe78,slot,
             (ConnectionType)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  this_00 = (array<QMetaObject::Connection,_10UL> *)(local_28 + 8);
  QAbstractItemView::selectionModel(pQVar1);
  receiverPrivate = QItemSelectionModel::selectionChanged;
  sender = (Object *)0x0;
  QObject::
  connect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),void(QTableWidget::*)()>
            (in_stack_fffffffffffffe70,signal,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
             (ConnectionType)signal_00);
  type = AutoConnection;
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QTableWidgetPrivate::*)(QModelIndex_const&,QModelIndex_const&)>
            (sender,signal_00,(Object *)receiverPrivate,slot,AutoConnection);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QTableWidgetPrivate::*)()>
            (sender,signal_00,(Object *)receiverPrivate,slot,type);
  std::array<QMetaObject::Connection,_10UL>::operator=(this_00,paVar2);
  std::array<QMetaObject::Connection,_10UL>::~array(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidgetPrivate::setup()
{
    Q_Q(QTableWidget);
    connections = {
        // view signals
        QObjectPrivate::connect(q, &QTableWidget::pressed,
                                this, &QTableWidgetPrivate::emitItemPressed),
        QObjectPrivate::connect(q, &QTableWidget::clicked,
                                this, &QTableWidgetPrivate::emitItemClicked),
        QObjectPrivate::connect(q, &QTableWidget::doubleClicked,
                                this, &QTableWidgetPrivate::emitItemDoubleClicked),
        QObjectPrivate::connect(q, &QTableWidget::activated,
                                this, &QTableWidgetPrivate::emitItemActivated),
        QObjectPrivate::connect(q, &QTableWidget::entered,
                                this, &QTableWidgetPrivate::emitItemEntered),
        // model signals
        QObjectPrivate::connect(model, &QAbstractItemModel::dataChanged,
                                this, &QTableWidgetPrivate::emitItemChanged),
        // selection signals
        QObjectPrivate::connect(q->selectionModel(), &QItemSelectionModel::currentChanged,
                                this, &QTableWidgetPrivate::emitCurrentItemChanged),
        QObject::connect(q->selectionModel(), &QItemSelectionModel::selectionChanged,
                         q, &QTableWidget::itemSelectionChanged),
        // sorting
        QObjectPrivate::connect(model, &QAbstractItemModel::dataChanged,
                                this, &QTableWidgetPrivate::dataChanged),
        QObjectPrivate::connect(model, &QAbstractItemModel::columnsRemoved,
                                this, &QTableWidgetPrivate::sort)
    };
}